

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O3

char * __thiscall
TestMemoryAllocator::alloc_memory
          (TestMemoryAllocator *this,size_t size,char *param_2,size_t param_3)

{
  char *pcVar1;
  UtestShell *pUVar2;
  TestTerminatorWithoutExceptions local_10;
  
  pcVar1 = (char *)(*PlatformSpecificMalloc)(size);
  if (pcVar1 == (char *)0x0) {
    pUVar2 = UtestShell::getCurrent();
    local_10.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001658c0;
    (*pUVar2->_vptr_UtestShell[0x1a])
              (pUVar2,"malloc returned null pointer",
               "/workspace/llm4binary/github/license_c_cmakelists/approvals[P]ApprovalTests/build_O3/CMake/cpputest/cpputest-src/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x25);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_10);
  }
  return pcVar1;
}

Assistant:

char* TestMemoryAllocator::alloc_memory(size_t size, const char*, size_t)
{
    return checkedMalloc(size);
}